

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O0

ResamplerStage *
SRCTools::SincResampler::createSincResampler
          (double inputFrequency,double outputFrequency,double passbandFrequency,
          double stopbandFrequency,double dbSNR,uint maxUpsampleFactor)

{
  uint order_00;
  FIRCoefficient *kernel;
  FIRResampler *this;
  double dVar1;
  double fp_00;
  double beta_00;
  ResamplerStage *windowedSincStage;
  FIRCoefficient *windowedSincKernel;
  uint kernelLength;
  uint order;
  double beta;
  double fc;
  double fs;
  double fp;
  double baseSamplePeriod;
  double downsampleFactor;
  uint upsampleFactor;
  uint maxUpsampleFactor_local;
  double dbSNR_local;
  double stopbandFrequency_local;
  double passbandFrequency_local;
  double outputFrequency_local;
  double inputFrequency_local;
  
  downsampleFactor._4_4_ = maxUpsampleFactor;
  _upsampleFactor = dbSNR;
  dbSNR_local = stopbandFrequency;
  stopbandFrequency_local = passbandFrequency;
  passbandFrequency_local = outputFrequency;
  outputFrequency_local = inputFrequency;
  Utils::computeResampleFactors
            ((uint *)&downsampleFactor,&baseSamplePeriod,inputFrequency,outputFrequency,
             maxUpsampleFactor);
  dVar1 = 1.0 / (outputFrequency_local * (double)downsampleFactor._0_4_);
  fp_00 = stopbandFrequency_local * dVar1;
  dVar1 = dbSNR_local * dVar1;
  beta_00 = KaizerWindow::estimateBeta(_upsampleFactor);
  order_00 = KaizerWindow::estimateOrder(_upsampleFactor,fp_00,dVar1);
  kernel = (FIRCoefficient *)operator_new__((ulong)(order_00 + 1) << 2);
  KaizerWindow::windowedSinc
            (kernel,order_00,(fp_00 + dVar1) * 0.5,beta_00,(double)downsampleFactor._0_4_);
  this = (FIRResampler *)operator_new(0x48);
  FIRResampler::FIRResampler(this,downsampleFactor._0_4_,baseSamplePeriod,kernel,order_00 + 1);
  if (kernel != (FIRCoefficient *)0x0) {
    operator_delete__(kernel);
  }
  return &this->super_ResamplerStage;
}

Assistant:

ResamplerStage *SincResampler::createSincResampler(const double inputFrequency, const double outputFrequency, const double passbandFrequency, const double stopbandFrequency, const double dbSNR, const unsigned int maxUpsampleFactor) {
	unsigned int upsampleFactor;
	double downsampleFactor;
	computeResampleFactors(upsampleFactor, downsampleFactor, inputFrequency, outputFrequency, maxUpsampleFactor);
	double baseSamplePeriod = 1.0 / (inputFrequency * upsampleFactor);
	double fp = passbandFrequency * baseSamplePeriod;
	double fs = stopbandFrequency * baseSamplePeriod;
	double fc = 0.5 * (fp + fs);
	double beta = KaizerWindow::estimateBeta(dbSNR);
	unsigned int order = KaizerWindow::estimateOrder(dbSNR, fp, fs);
	const unsigned int kernelLength = order + 1;

#ifdef SRCTOOLS_SINC_RESAMPLER_DEBUG_LOG
	std::clog << "FIR: " << upsampleFactor << "/" << downsampleFactor << ", N=" << kernelLength << ", NPh=" << kernelLength / double(upsampleFactor) << ", C=" << 0.5 / fc << ", fp=" << fp << ", fs=" << fs << ", M=" << maxUpsampleFactor << std::endl;
#endif

	FIRCoefficient *windowedSincKernel = new FIRCoefficient[kernelLength];
	KaizerWindow::windowedSinc(windowedSincKernel, order, fc, beta, upsampleFactor);
	ResamplerStage *windowedSincStage = new FIRResampler(upsampleFactor, downsampleFactor, windowedSincKernel, kernelLength);
	delete[] windowedSincKernel;
	return windowedSincStage;
}